

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void test_send_text_binary_frame(void)

{
  frame_direction fVar1;
  uint uVar2;
  cio_websocket *websocket;
  _Bool _Var3;
  cio_error cVar4;
  anon_union_8_2_1b11d445_for_anon_struct_16_2_5bd11894_for_element_0 __s;
  char *pcVar5;
  long actual;
  ulong __size;
  long lVar6;
  bool bVar7;
  uint32_t context;
  cio_write_buffer wbh;
  cio_write_buffer wb;
  undefined4 local_b4;
  char *local_b0;
  cio_write_buffer local_a8;
  long local_88;
  ulong local_80;
  ws_frame local_78;
  cio_write_buffer local_50;
  
  local_88 = 0;
  do {
    __size = (ulong)(uint)(&DAT_00111fc0)[local_88];
    local_80 = __size;
    uVar2 = 0;
    do {
      lVar6 = 0;
      do {
        fVar1 = *(frame_direction *)((long)&DAT_00111fe8 + lVar6);
        __s.const_data = malloc(__size);
        if (__s.const_data == (void *)0x0) {
          UnityFail("Could not allocate memory for test frame!",0x9f1);
        }
        memset(__s.const_data,0x61,__size);
        pcVar5 = (char *)malloc(__size);
        if (pcVar5 == (char *)0x0) {
          UnityFail("Could not allocate memory for check frame!",0x9f6);
        }
        local_b0 = pcVar5;
        memset(pcVar5,0x61,__size);
        local_78.frame_type = CIO_WEBSOCKET_CLOSE_FRAME;
        local_78.data = (void *)0x0;
        local_78.data_length = 0;
        local_78.last_frame = true;
        local_78.rsv = false;
        local_78.direction = fVar1;
        serialize_frames(&local_78,1);
        websocket = ws;
        local_a8.next = &local_50;
        local_a8.data.head.q_len =
             (size_t)(anon_union_8_2_1b11d445_for_anon_struct_16_2_5bd11894_for_element_0)0x1;
        *(ushort *)&(ws->ws_private).ws_flags =
             SUB42((ws->ws_private).ws_flags,0) & 0xfbff | (ushort)(lVar6 == 0) << 10;
        local_b4 = 0x1234568;
        local_a8.prev = local_a8.next;
        local_a8.data.element.length = __size;
        local_50.next = &local_a8;
        local_50.prev = &local_a8;
        local_50.data.head.q_len = (size_t)__s.const_data;
        local_50.data.element.length = __size;
        if ((uVar2 & 1) == 0) {
          cVar4 = cio_websocket_write_message_first_chunk
                            (websocket,__size,&local_a8,true,true,write_handler,&local_b4);
          UnityAssertEqualNumber
                    (0,(long)cVar4,"Writing a binary frame did not succeed!",0xa0f,
                     UNITY_DISPLAY_STYLE_INT);
          pcVar5 = local_b0;
          _Var3 = check_frame(CIO_WEBSOCKET_BINARY_FRAME,local_b0,__size,true);
          if (!_Var3) {
            UnityFail("First frame send is incorrect binary frame!",0xa10);
          }
        }
        else {
          cVar4 = cio_websocket_write_message_first_chunk
                            (websocket,__size,&local_a8,true,false,write_handler,&local_b4);
          UnityAssertEqualNumber
                    (0,(long)cVar4,"Writing a text frame did not succeed!",0xa0b,
                     UNITY_DISPLAY_STYLE_INT);
          pcVar5 = local_b0;
          _Var3 = check_frame(CIO_WEBSOCKET_TEXT_FRAME,local_b0,__size,true);
          if (!_Var3) {
            UnityFail("First frame send is incorrect text frame!",0xa0c);
          }
        }
        cVar4 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
        actual = (long)cVar4;
        UnityAssertEqualNumber
                  (0,actual,"Could not start reading a message!",0xa14,UNITY_DISPLAY_STYLE_INT);
        _Var3 = is_close_frame(1000,SUB81(actual,0));
        if (!_Var3) {
          UnityFail("written frame is not a close frame!",0xa15);
        }
        UnityAssertEqualNumber
                  (1,(ulong)write_handler_fake.call_count,"write handler was not called!",0xa17,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_val,
                   "websocket pointer in write handler not correct!",0xa18,UNITY_DISPLAY_STYLE_HEX64
                  );
        UnityAssertEqualNumber
                  ((UNITY_INT)&local_b4,(UNITY_INT)write_handler_fake.arg1_val,
                   "context pointer in write handler not correct!",0xa19,UNITY_DISPLAY_STYLE_HEX64);
        UnityAssertEqualNumber
                  (0,(long)write_handler_fake.arg2_val,"error code in write handler not correct!",
                   0xa1a,UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  (1,local_a8.data.head.q_len,
                   "Length of write buffer different than before writing!",0xa1c,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  ((UNITY_INT)&local_a8,(UNITY_INT)(local_a8.next)->next,
                   "Concatenation of write buffers no longer correct after writing!",0xa1d,
                   UNITY_DISPLAY_STYLE_INT);
        __size = local_80;
        UnityAssertEqualMemory
                  (__s.const_data,((local_a8.next)->data).element.field_0.const_data,
                   (UNITY_UINT32)local_80,1,"Content of writebuffer not correct after writing!",
                   0xa1e,UNITY_ARRAY_TO_ARRAY);
        UnityAssertEqualNumber
                  (0,(ulong)on_error_fake.call_count,"error callback was called",0xa20,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  (1,(ulong)on_control_fake.call_count,
                   "control callback was called not for last close frame",0xa21,
                   UNITY_DISPLAY_STYLE_INT);
        free(__s.const_data);
        free(pcVar5);
        free(ws);
        setUp();
        lVar6 = lVar6 + 4;
      } while (lVar6 == 4);
      bVar7 = uVar2 == 0;
      uVar2 = uVar2 + 1;
    } while (bVar7);
    local_88 = local_88 + 1;
    if (local_88 == 6) {
      return;
    }
  } while( true );
}

Assistant:

static void test_send_text_binary_frame(void)
{
	uint32_t frame_sizes[] = {1, 5, 125, 126, 65535, 65536};
	unsigned int frame_types[] = {CIO_WEBSOCKET_BINARY_FRAME, CIO_WEBSOCKET_TEXT_FRAME};
	enum frame_direction directions[] = {FROM_CLIENT, FROM_SERVER};

	for (unsigned int i = 0; i < ARRAY_SIZE(frame_sizes); i++) {
		for (unsigned int j = 0; j < ARRAY_SIZE(frame_types); j++) {
			for (unsigned int k = 0; k < ARRAY_SIZE(directions); k++) {
				enum frame_direction direction = directions[k];
				uint32_t frame_size = frame_sizes[i];
				char *data = malloc(frame_size);
				if (data == NULL) {
					TEST_FAIL_MESSAGE("Could not allocate memory for test frame!");
				}
				memset(data, 'a', frame_size);
				char *check_data = malloc(frame_size);
				if (check_data == NULL) {
					TEST_FAIL_MESSAGE("Could not allocate memory for check frame!");
				}
				memcpy(check_data, data, frame_size);

				struct ws_frame frames[] = {
				    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = direction, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
				};

				serialize_frames(frames, ARRAY_SIZE(frames));

				struct cio_write_buffer wbh;
				cio_write_buffer_head_init(&wbh);

				struct cio_write_buffer wb;
				cio_write_buffer_element_init(&wb, data, frame_size);
				cio_write_buffer_queue_tail(&wbh, &wb);

				ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
				uint32_t context = 0x1234568;
				if (frame_types[j] == CIO_WEBSOCKET_TEXT_FRAME) {
					enum cio_error err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&wbh), &wbh, true, false, write_handler, &context);
					TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a text frame did not succeed!");
					TEST_ASSERT_MESSAGE(check_frame(CIO_WEBSOCKET_TEXT_FRAME, check_data, frame_size, true), "First frame send is incorrect text frame!");
				} else if (frame_types[j] == CIO_WEBSOCKET_BINARY_FRAME) {
					enum cio_error err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&wbh), &wbh, true, true, write_handler, &context);
					TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a binary frame did not succeed!");
					TEST_ASSERT_MESSAGE(check_frame(CIO_WEBSOCKET_BINARY_FRAME, check_data, frame_size, true), "First frame send is incorrect binary frame!");
				}

				enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
				TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");
				TEST_ASSERT_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_NORMAL, true), "written frame is not a close frame!");

				TEST_ASSERT_EQUAL_MESSAGE(1, write_handler_fake.call_count, "write handler was not called!");
				TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, write_handler_fake.arg0_val, "websocket pointer in write handler not correct!");
				TEST_ASSERT_EQUAL_PTR_MESSAGE(&context, write_handler_fake.arg1_val, "context pointer in write handler not correct!");
				TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, write_handler_fake.arg2_val, "error code in write handler not correct!");

				TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Length of write buffer different than before writing!");
				TEST_ASSERT_EQUAL_MESSAGE(&wbh, wbh.next->next, "Concatenation of write buffers no longer correct after writing!");
				TEST_ASSERT_EQUAL_MEMORY_MESSAGE(data, wbh.next->data.element.data, frame_size, "Content of writebuffer not correct after writing!");

				TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");
				TEST_ASSERT_EQUAL_MESSAGE(1, on_control_fake.call_count, "control callback was called not for last close frame");

				if (data) {
					free(data);
				}

				if (check_data) {
					free(check_data);
				}

				free(ws);
				setUp();
			}
		}
	}
}